

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O2

string * tinyusdz::unwrap(string *__return_storage_ptr__,string *str,string *delim)

{
  ulong uVar1;
  ulong uVar2;
  __type _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  uVar1 = delim->_M_string_length;
  uVar2 = str->_M_string_length;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  if (uVar1 <= uVar2) {
    ::std::__cxx11::string::substr((ulong)&bStack_48,(ulong)__return_storage_ptr__);
    _Var3 = ::std::operator==(&bStack_48,delim);
    ::std::__cxx11::string::_M_dispose();
    if (_Var3) {
      ::std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
    }
    ::std::__cxx11::string::substr((ulong)&bStack_48,(ulong)__return_storage_ptr__);
    _Var3 = ::std::operator==(&bStack_48,delim);
    ::std::__cxx11::string::_M_dispose();
    if (_Var3) {
      ::std::__cxx11::string::erase
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - uVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string unwrap(const std::string &str,
                          const std::string &delim = "\"") {
  size_t n = delim.size();

  if (str.size() < n) {
    return str;
  }

  std::string s = str;

  if (s.substr(0, n) == delim) {
    s.erase(0, n);
  }

  if (s.substr(s.size() - n) == delim) {
    s.erase(s.size() - n);
  }

  return s;
}